

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  RepeatedField<int> *this;
  ulong uVar5;
  uint *puVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ulong uVar7;
  int value;
  char *pcVar8;
  int iVar9;
  ushort *puVar10;
  
  if (data.field_0._0_2_ != 0) {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  data_00 = data.field_0;
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  uVar2 = *(ushort *)ptr;
  uVar4 = *(uint *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  iVar9 = (int)(short)uVar4;
  do {
    pcVar8 = (char *)(long)(char)*(ushort *)((long)ptr + 2);
    if ((long)pcVar8 < 0) {
      uVar5 = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)uVar5 < 0) {
        data_00.data = (long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff;
        if ((long)data_00 < 0) {
          uVar5 = uVar5 & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
          if ((long)uVar5 < 0) {
            data_00.data = data_00.data &
                           ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU);
            if ((long)data_00.data < 0) {
              uVar5 = uVar5 & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
              if ((long)uVar5 < 0) {
                data_00.data = data_00.data &
                               ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU);
                if ((long)data_00 < 0) {
                  uVar5 = uVar5 & ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar5 < 0) {
                    uVar7 = (ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff;
                    data_00.data = data_00.data & uVar7;
                    if ((long)data_00 < 0) {
                      puVar10 = (ushort *)((long)ptr + 0xc);
                      bVar1 = *(byte *)((long)ptr + 0xb);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar8 = Error(msg,pcVar8,
                                         (ParseContext *)CONCAT71((int7)(uVar7 >> 8),bVar1),
                                         (TcFieldData)data_00,table,hasbits);
                          return pcVar8;
                        }
                        if ((bVar1 & 1) == 0) {
                          data_00.data = data_00.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      puVar10 = (ushort *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    puVar10 = (ushort *)((long)ptr + 10);
                  }
                }
                else {
                  puVar10 = (ushort *)((long)ptr + 9);
                }
              }
              else {
                puVar10 = (ushort *)((long)ptr + 8);
              }
            }
            else {
              puVar10 = (ushort *)((long)ptr + 7);
            }
          }
          else {
            puVar10 = (ushort *)((long)ptr + 6);
          }
        }
        else {
          puVar10 = (ushort *)((long)ptr + 5);
        }
        uVar5 = uVar5 & data_00.data;
      }
      else {
        puVar10 = (ushort *)((long)ptr + 4);
      }
      pcVar8 = (char *)((ulong)pcVar8 & uVar5);
    }
    else {
      puVar10 = (ushort *)((long)ptr + 3);
    }
    value = (int)pcVar8;
    if ((value < iVar9) || ((int)((uVar4 >> 0x10) + iVar9) <= value)) {
      pcVar8 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar8;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar6 = *puVar6 | (uint)hasbits;
      }
      return (char *)puVar10;
    }
    uVar3 = *puVar10;
    data_00.data._2_6_ = 0;
    data_00.data._0_2_ = uVar3;
    ptr = (char *)puVar10;
  } while (uVar3 == uVar2);
  uVar4 = (uint)table->fast_idx_mask & (uint)uVar3;
  if ((uVar4 & 7) == 0) {
    uVar5 = (ulong)(uVar4 & 0xfffffff8);
    pcVar8 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar10,ctx,
                                data_00.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),table
                                ,hasbits);
    return pcVar8;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint16_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}